

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration
          (SingleFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  SingleFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGenerator).variables_,"$comments$");
  io::Printer::Print(printer,&(this->super_FieldGenerator).variables_,
                     "@property(nonatomic, readwrite) $property_type$ $name$$deprecated_attribute$;\n\n"
                    );
  bVar1 = FieldGenerator::WantsHasProperty(&this->super_FieldGenerator);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_FieldGenerator).variables_,
                       "@property(nonatomic, readwrite) BOOL has$capitalized_name$$deprecated_attribute$;\n"
                      );
  }
  return;
}

Assistant:

void SingleFieldGenerator::GeneratePropertyDeclaration(
    io::Printer* printer) const {
  printer->Print(variables_, "$comments$");
  printer->Print(
      variables_,
      "@property(nonatomic, readwrite) $property_type$ $name$$deprecated_attribute$;\n"
      "\n");
  if (WantsHasProperty()) {
    printer->Print(
        variables_,
        "@property(nonatomic, readwrite) BOOL has$capitalized_name$$deprecated_attribute$;\n");
  }
}